

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O2

void multikey_cache<4u,true>(Cacheblock<4U>_conflict *cache,size_t N,size_t depth)

{
  byte *pbVar1;
  uchar *puVar2;
  uchar *puVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  size_t i;
  ulong uVar7;
  Cacheblock<4U>_conflict *pCVar8;
  Cacheblock<4U>_conflict *pCVar9;
  Cacheblock<4U>_conflict *pCVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
LAB_001fdef2:
  if (N < 0x20) {
    if (N == 0) {
      return;
    }
    insertion_sort<4u>(cache,(int)N,depth);
    return;
  }
  uVar7 = 0;
  do {
    if (uVar7 == N) {
      uVar14 = N >> 3;
      pCVar8 = med3char<Cacheblock<4u>,Cmp>(cache,cache + uVar14,cache + (N >> 2));
      pCVar9 = med3char<Cacheblock<4u>,Cmp>
                         (cache + ((N >> 1) - uVar14),cache + (N >> 1),cache + (N >> 1) + uVar14);
      uVar7 = N - 1;
      pCVar10 = med3char<Cacheblock<4u>,Cmp>
                          (cache + (uVar7 - (N >> 2)),cache + (uVar7 - uVar14),cache + (N - 3));
      pCVar8 = med3char<Cacheblock<4u>,Cmp>(pCVar8,pCVar9,pCVar10);
      uVar5 = cache->cached_bytes;
      uVar6 = *(undefined4 *)&cache->field_0x4;
      puVar2 = cache->ptr;
      uVar4 = *(undefined4 *)&pCVar8->field_0x4;
      puVar3 = pCVar8->ptr;
      cache->cached_bytes = pCVar8->cached_bytes;
      *(undefined4 *)&cache->field_0x4 = uVar4;
      cache->ptr = puVar3;
      pCVar8->cached_bytes = uVar5;
      *(undefined4 *)&pCVar8->field_0x4 = uVar6;
      pCVar8->ptr = puVar2;
      uVar13 = cache->cached_bytes;
      uVar14 = 1;
      uVar11 = uVar7;
      uVar16 = uVar14;
      uVar18 = uVar7;
      do {
        for (pCVar8 = cache + uVar14; (uVar14 <= uVar11 && (pCVar8->cached_bytes <= uVar13));
            pCVar8 = pCVar8 + 1) {
          uVar17 = uVar16;
          if (uVar13 <= pCVar8->cached_bytes) {
            uVar17 = uVar16 + 1;
            pCVar9 = cache + uVar16;
            uVar5 = pCVar9->cached_bytes;
            uVar6 = *(undefined4 *)&pCVar9->field_0x4;
            puVar2 = pCVar9->ptr;
            uVar4 = *(undefined4 *)&pCVar8->field_0x4;
            puVar3 = pCVar8->ptr;
            pCVar9 = cache + uVar16;
            pCVar9->cached_bytes = pCVar8->cached_bytes;
            *(undefined4 *)&pCVar9->field_0x4 = uVar4;
            pCVar9->ptr = puVar3;
            pCVar8->cached_bytes = uVar5;
            *(undefined4 *)&pCVar8->field_0x4 = uVar6;
            pCVar8->ptr = puVar2;
          }
          uVar14 = uVar14 + 1;
          uVar16 = uVar17;
        }
        pCVar9 = cache + uVar11;
        while( true ) {
          if (uVar11 < uVar14) {
            uVar7 = uVar7 - uVar18;
            sVar15 = uVar18 - uVar11;
            uVar14 = uVar14 - uVar16;
            uVar11 = uVar16;
            if (uVar14 < uVar16) {
              uVar11 = uVar14;
            }
            std::swap_ranges<Cacheblock<4u>*,Cacheblock<4u>*>(cache,cache + uVar11,pCVar8 + -uVar11)
            ;
            uVar11 = uVar7;
            if (sVar15 < uVar7) {
              uVar11 = sVar15;
            }
            std::swap_ranges<Cacheblock<4u>*,Cacheblock<4u>*>
                      (pCVar8,pCVar8 + uVar11,cache + (N - uVar11));
            multikey_cache<4u,false>(cache,uVar14,depth);
            multikey_cache<4u,false>(pCVar8 + ((N - 1) - uVar18),sVar15,depth);
            if ((char)uVar13 == '\0') {
              return;
            }
            N = uVar7 + uVar16;
            cache = pCVar8 + -uVar16;
            depth = depth + 4;
            goto LAB_001fdef2;
          }
          if (pCVar9->cached_bytes < uVar13) break;
          uVar17 = uVar18;
          if (pCVar9->cached_bytes == uVar13) {
            uVar17 = uVar18 - 1;
            pCVar10 = cache + uVar18;
            uVar5 = pCVar10->cached_bytes;
            uVar6 = *(undefined4 *)&pCVar10->field_0x4;
            puVar2 = pCVar10->ptr;
            uVar4 = *(undefined4 *)&pCVar9->field_0x4;
            puVar3 = pCVar9->ptr;
            pCVar10 = cache + uVar18;
            pCVar10->cached_bytes = pCVar9->cached_bytes;
            *(undefined4 *)&pCVar10->field_0x4 = uVar4;
            pCVar10->ptr = puVar3;
            pCVar9->cached_bytes = uVar5;
            *(undefined4 *)&pCVar9->field_0x4 = uVar6;
            pCVar9->ptr = puVar2;
          }
          uVar11 = uVar11 - 1;
          pCVar9 = pCVar9 + -1;
          uVar18 = uVar17;
        }
        uVar5 = pCVar8->cached_bytes;
        uVar6 = *(undefined4 *)&pCVar8->field_0x4;
        puVar2 = pCVar8->ptr;
        uVar4 = *(undefined4 *)&pCVar9->field_0x4;
        puVar3 = pCVar9->ptr;
        pCVar8->cached_bytes = pCVar9->cached_bytes;
        *(undefined4 *)&pCVar8->field_0x4 = uVar4;
        pCVar8->ptr = puVar3;
        pCVar9->cached_bytes = uVar5;
        *(undefined4 *)&pCVar9->field_0x4 = uVar6;
        pCVar9->ptr = puVar2;
        uVar14 = uVar14 + 1;
        uVar11 = uVar11 - 1;
      } while( true );
    }
    uVar13 = 0;
    lVar12 = 0x20;
    sVar15 = depth;
    do {
      if (lVar12 == 0) break;
      pbVar1 = cache[uVar7].ptr + sVar15;
      lVar12 = lVar12 + -8;
      uVar13 = uVar13 | (uint)*pbVar1 << ((byte)lVar12 & 0x1f);
      sVar15 = sVar15 + 1;
    } while (*pbVar1 != 0);
    cache[uVar7].cached_bytes = uVar13;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}